

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O1

void mpz_lcm_ui(__mpz_struct *r,__mpz_struct *u,unsigned_long v)

{
  int iVar1;
  unsigned_long uVar2;
  int iVar3;
  
  if ((v == 0) || (u->_mp_size == 0)) {
    r->_mp_size = 0;
  }
  else {
    uVar2 = mpz_gcd_ui((__mpz_struct *)0x0,u,v);
    mpz_mul_ui(r,u,v / uVar2);
    iVar1 = r->_mp_size;
    iVar3 = -iVar1;
    if (0 < iVar1) {
      iVar3 = iVar1;
    }
    r->_mp_size = iVar3;
  }
  return;
}

Assistant:

void
mpz_lcm_ui (mpz_t r, const mpz_t u, unsigned long v)
{
  if (v == 0 || u->_mp_size == 0)
    {
      r->_mp_size = 0;
      return;
    }

  v /= mpz_gcd_ui (NULL, u, v);
  mpz_mul_ui (r, u, v);

  mpz_abs (r, r);
}